

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_false>_>_>
::_reduce_column(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_false>_>_>
                 *this,Index target,Index eventIndex)

{
  uint uVar1;
  uint uVar2;
  undefined1 *puVar3;
  pointer pIVar4;
  Zp_field_operators<unsigned_int,_void> *this_00;
  node_ptr plVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  Column_support *pCVar9;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_false>_>_>
  *targetColumn;
  uint local_3c;
  pointer local_38;
  
  local_38 = (this->reducedMatrixR_).matrix_.
             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_false>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  pCVar9 = &local_38[target].column_;
  puVar3 = *(undefined1 **)&(pCVar9->super_type).data_.root_plus_size_;
  if ((Column_support *)puVar3 != pCVar9 && puVar3 != (undefined1 *)0x0) {
    local_38 = local_38 + target;
    uVar7 = (ulong)*(uint *)&(*(node_ptr *)((long)&(local_38->column_).super_type.data_ + 8))[1].
                             next_;
    if (uVar7 != 0xffffffff) {
      while (uVar1 = (this->pivotToColumnIndex_).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar7], uVar1 != 0xffffffff) {
        pIVar4 = (this->reducedMatrixR_).matrix_.
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_false>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar3 = *(undefined1 **)&pIVar4[uVar1].column_.super_type.data_.root_plus_size_;
        uVar8 = 0;
        if ((Column_support *)puVar3 != &pIVar4[uVar1].column_ && puVar3 != (undefined1 *)0x0) {
          uVar8 = *(uint *)((long)&pIVar4[uVar1].column_.super_type.data_.root_plus_size_.m_header.
                                   super_node.prev_[-1].prev_ + 4);
        }
        this_00 = this->operators_;
        uVar2 = this_00->characteristic_;
        if (uVar2 <= uVar8) {
          uVar8 = uVar8 % uVar2;
        }
        targetColumn = pIVar4 + target;
        local_3c = (this_00->inverse_).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar8];
        plVar5 = (targetColumn->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
        iVar6 = 0;
        if (plVar5 != (node_ptr)&targetColumn->column_ && plVar5 != (node_ptr)0x0) {
          iVar6 = *(int *)((long)&(targetColumn->column_).super_type.data_.root_plus_size_.m_header.
                                  super_node.prev_[-1].prev_ + 4);
        }
        persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace
                  (this_00,&local_3c,uVar2 - iVar6);
        _multiply_source_and_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,true,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,true,false>>>>
                  (&local_3c,pIVar4 + uVar1,targetColumn);
        pIVar4 = (this->mirrorMatrixU_).matrix_.
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_false>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        _multiply_source_and_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,true,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,true,false>>>>
                  (&local_3c,pIVar4 + uVar1,pIVar4 + target);
        puVar3 = *(undefined1 **)&(pCVar9->super_type).data_.root_plus_size_;
        if (puVar3 == (undefined1 *)0x0) {
          return;
        }
        if ((Column_support *)puVar3 == pCVar9) {
          return;
        }
        uVar7 = (ulong)*(uint *)&(*(node_ptr *)((long)&(local_38->column_).super_type.data_ + 8))[1]
                                 .next_;
        if (uVar7 == 0xffffffff) {
          return;
        }
      }
      (this->pivotToColumnIndex_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar7] = target;
    }
  }
  return;
}

Assistant:

inline void RU_matrix<Master_matrix>::_reduce_column(Index target, Index eventIndex)
{
  auto get_column_with_pivot_ = [&](ID_index pivot) -> Index {
    if (pivot == Master_matrix::template get_null_value<ID_index>())
      return Master_matrix::template get_null_value<Index>();
    if constexpr (Master_matrix::Option_list::has_map_column_container) {
      auto it = pivotToColumnIndex_.find(pivot);
      if (it == pivotToColumnIndex_.end())
        return Master_matrix::template get_null_value<Index>();
      else
        return it->second;
    } else {
      return pivotToColumnIndex_[pivot];
    }
  };

  Column& curr = reducedMatrixR_.get_column(target);
  ID_index pivot = curr.get_pivot();
  Index currIndex = get_column_with_pivot_(pivot);

  while (pivot != Master_matrix::template get_null_value<ID_index>() &&
         currIndex != Master_matrix::template get_null_value<Index>()) {
    _reduce_column_by(target, currIndex);
    pivot = curr.get_pivot();
    currIndex = get_column_with_pivot_(pivot);
  }

  if (pivot != Master_matrix::template get_null_value<ID_index>()) {
    if constexpr (Master_matrix::Option_list::has_map_column_container) {
      pivotToColumnIndex_.try_emplace(pivot, target);
    } else {
      pivotToColumnIndex_[pivot] = target;
    }
    _update_barcode(pivot, eventIndex);
  } else {
    _add_bar(get_column_dimension(target), eventIndex);
  }
}